

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O3

Builder * __thiscall
capnp::DynamicList::Builder::operator[](Builder *__return_storage_ptr__,Builder *this,uint index)

{
  double dVar1;
  byte bVar2;
  undefined2 uVar3;
  ElementSize elementSize;
  Which WVar4;
  uint uVar5;
  StructSchema SVar6;
  ulong uVar7;
  EnumSchema EVar8;
  InterfaceSchema IVar9;
  uint uVar10;
  Type TVar11;
  ArrayPtr<unsigned_char> AVar12;
  uint index_local;
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  Fault f;
  CapTableBuilder *pCStack_e0;
  ListSchema elementType;
  Schema local_c0;
  Builder local_b8;
  StructBuilder local_a0;
  ListBuilder local_78;
  ListBuilder local_50;
  
  _kjCondition.left = &index_local;
  uVar5 = (this->builder).elementCount;
  _kjCondition.right = uVar5;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = index < uVar5;
  index_local = index;
  if (uVar5 <= index) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x44a,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
               &_kjCondition,(char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::fatal(&f);
  }
  WVar4 = LIST;
  if ((this->schema).elementType.listDepth == '\0') {
    WVar4 = (this->schema).elementType.baseType;
  }
  switch(WVar4) {
  case VOID:
    __return_storage_ptr__->type = VOID;
    break;
  case BOOL:
    bVar2 = (this->builder).ptr[index >> 3];
    __return_storage_ptr__->type = BOOL;
    (__return_storage_ptr__->field_1).boolValue = (bVar2 >> (index & 7) & 1) != 0;
    break;
  case INT8:
    uVar7 = (ulong)(char)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_001b22dc;
  case INT16:
    uVar7 = (ulong)*(short *)((this->builder).ptr +
                             ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001b22dc;
  case INT32:
    uVar7 = (ulong)*(int *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3))
    ;
    goto LAB_001b22dc;
  case INT64:
    uVar7 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_001b22dc:
    __return_storage_ptr__->type = INT;
LAB_001b237a:
    (__return_storage_ptr__->field_1).intValue = uVar7;
    break;
  case UINT8:
    uVar7 = (ulong)(this->builder).ptr[(ulong)(this->builder).step * (ulong)index >> 3];
    goto LAB_001b2374;
  case UINT16:
    uVar7 = (ulong)*(ushort *)
                    ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001b2374;
  case UINT32:
    uVar7 = (ulong)*(uint *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3)
                            );
    goto LAB_001b2374;
  case UINT64:
    uVar7 = *(ulong *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_001b2374:
    __return_storage_ptr__->type = UINT;
    goto LAB_001b237a;
  case FLOAT32:
    dVar1 = (double)*(float *)((this->builder).ptr +
                              ((ulong)(this->builder).step * (ulong)index >> 3));
    goto LAB_001b2352;
  case FLOAT64:
    dVar1 = *(double *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
LAB_001b2352:
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = (int64_t)dVar1;
    break;
  case TEXT:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    _::PointerBuilder::getBlob<capnp::Text>(&local_b8,(PointerBuilder *)&_kjCondition,(void *)0x0,0)
    ;
    (__return_storage_ptr__->field_1).textValue.content.size_ = local_b8.content.size_;
    (__return_storage_ptr__->field_1).intValue = local_b8._0_8_;
    (__return_storage_ptr__->field_1).textValue.content.ptr = local_b8.content.ptr;
    __return_storage_ptr__->type = TEXT;
    break;
  case DATA:
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    AVar12 = (ArrayPtr<unsigned_char>)
             _::PointerBuilder::getBlob<capnp::Data>((PointerBuilder *)&_kjCondition,(void *)0x0,0);
    __return_storage_ptr__->type = DATA;
    (__return_storage_ptr__->field_1).dataValue.super_ArrayPtr<unsigned_char> = AVar12;
    break;
  case LIST:
    TVar11 = (Type)Type::asList((Type *)this);
    elementType.elementType = TVar11;
    if (TVar11.baseType == STRUCT &&
        ((undefined1  [16])TVar11 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
      f.exception = (Exception *)(this->builder).segment;
      local_c0.raw = (RawBrandedSchema *)Type::asStruct(&elementType.elementType);
      Schema::getProto((Reader *)&_kjCondition,&local_c0);
      uVar5 = 0;
      if ((uint)_kjCondition._32_4_ < 0x80) {
        uVar10 = 0;
      }
      else {
        uVar10 = (uint)*(ushort *)(_kjCondition.op.content.ptr + 0xe);
        if (0xcf < (uint)_kjCondition._32_4_) {
          uVar5 = (uint)*(ushort *)(_kjCondition.op.content.ptr + 0x18) << 0x10;
        }
      }
      _::PointerBuilder::getStructList
                (&local_50,(PointerBuilder *)&f,(StructSize)(uVar10 | uVar5),(word *)0x0);
      *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_50.structDataSize;
      *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
           local_50.structPointerCount;
      *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_50.elementSize;
      *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_50._39_1_;
    }
    else {
      _kjCondition.op.content.ptr =
           (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
      _kjCondition.left = (uint *)(this->builder).segment;
      _kjCondition._8_8_ = (this->builder).capTable;
      WVar4 = LIST;
      if (((undefined1  [16])TVar11 & (undefined1  [16])0xff0000) == (undefined1  [16])0x0) {
        WVar4 = TVar11.baseType;
      }
      elementSize = anon_unknown_71::elementSizeFor(WVar4);
      _::PointerBuilder::getList(&local_78,(PointerBuilder *)&_kjCondition,elementSize,(word *)0x0);
      *(StructDataBitCount *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_78.structDataSize;
      *(StructPointerCount *)((long)&__return_storage_ptr__->field_1 + 0x34) =
           local_78.structPointerCount;
      *(ElementSize *)((long)&__return_storage_ptr__->field_1 + 0x36) = local_78.elementSize;
      *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 0x37) = local_78._39_1_;
      local_50.segment._0_4_ = local_78.segment._0_4_;
      local_50.segment._4_4_ = local_78.segment._4_4_;
      local_50.capTable._0_4_ = local_78.capTable._0_4_;
      local_50.capTable._4_4_ = local_78.capTable._4_4_;
      local_50.ptr._0_4_ = local_78.ptr._0_4_;
      local_50.ptr._4_4_ = local_78.ptr._4_4_;
      local_50.elementCount = local_78.elementCount;
      local_50.step = local_78.step;
    }
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_50.ptr._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x24) = local_50.ptr._4_4_;
    *(ListElementCount *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_50.elementCount;
    *(BitsPerElementN<23> *)((long)&__return_storage_ptr__->field_1 + 0x2c) = local_50.step;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_50.segment._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x14) = local_50.segment._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x18) = local_50.capTable._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_1 + 0x1c) = local_50.capTable._4_4_;
    __return_storage_ptr__->type = LIST;
    (__return_storage_ptr__->field_1).listValue.schema.elementType = TVar11;
    break;
  case ENUM:
    EVar8 = Type::asEnum((Type *)this);
    uVar3 = *(undefined2 *)
             ((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
    __return_storage_ptr__->type = ENUM;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)EVar8.super_Schema.raw;
    *(undefined2 *)&(__return_storage_ptr__->field_1).listValue.schema.elementType.field_4 = uVar3;
    break;
  case STRUCT:
    SVar6 = Type::asStruct((Type *)this);
    _::ListBuilder::getStructElement(&local_a0,&this->builder,index_local);
    *(undefined8 *)&(__return_storage_ptr__->field_1).listValue.builder.elementCount =
         local_a0._32_8_;
    (__return_storage_ptr__->field_1).listValue.builder.capTable = (CapTableBuilder *)local_a0.data;
    (__return_storage_ptr__->field_1).listValue.builder.ptr = (byte *)local_a0.pointers;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)local_a0.segment;
    (__return_storage_ptr__->field_1).textValue.content.size_ = (size_t)local_a0.capTable;
    __return_storage_ptr__->type = STRUCT;
    (__return_storage_ptr__->field_1).structValue.schema.super_Schema.raw =
         (RawBrandedSchema *)SVar6.super_Schema.raw;
    break;
  case INTERFACE:
    IVar9 = Type::asInterface((Type *)this);
    _kjCondition.op.content.ptr =
         (char *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index_local >> 3));
    _kjCondition.left = (uint *)(this->builder).segment;
    _kjCondition._8_8_ = (this->builder).capTable;
    _::PointerBuilder::getCapability((PointerBuilder *)&f);
    __return_storage_ptr__->type = CAPABILITY;
    (__return_storage_ptr__->field_1).enumValue.schema.super_Schema.raw =
         (RawBrandedSchema *)f.exception;
    (__return_storage_ptr__->field_1).textValue.content.ptr = (char *)pCStack_e0;
    (__return_storage_ptr__->field_1).capabilityValue.schema.super_Schema.raw =
         (RawBrandedSchema *)IVar9.super_Schema.raw;
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              ((Fault *)&_kjCondition,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x47d,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal((Fault *)&_kjCondition);
  default:
    __return_storage_ptr__->type = UNKNOWN;
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder DynamicList::Builder::operator[](uint index) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.");

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      return builder.getDataElement<typeName>(bounded(index) * ELEMENTS);

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Text>(nullptr, ZERO * BYTES);
    case schema::Type::DATA:
      return builder.getPointerElement(bounded(index) * ELEMENTS)
                    .getBlob<Data>(nullptr, ZERO * BYTES);

    case schema::Type::LIST: {
      ListSchema elementType = schema.getListElementType();
      if (elementType.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getStructList(structSizeFromSchema(elementType.getStructElementType()),
                                  nullptr));
      } else {
        return DynamicList::Builder(elementType,
            builder.getPointerElement(bounded(index) * ELEMENTS)
                   .getList(elementSizeFor(elementType.whichElementType()), nullptr));
      }
    }

    case schema::Type::STRUCT:
      return DynamicStruct::Builder(schema.getStructElementType(),
                                    builder.getStructElement(bounded(index) * ELEMENTS));

    case schema::Type::ENUM:
      return DynamicEnum(schema.getEnumElementType(),
                         builder.getDataElement<uint16_t>(bounded(index) * ELEMENTS));

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.");
      return nullptr;

    case schema::Type::INTERFACE:
      return DynamicCapability::Client(schema.getInterfaceElementType(),
                                       builder.getPointerElement(bounded(index) * ELEMENTS)
                                              .getCapability());
  }

  return nullptr;
}